

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall
wabt::interp::ElemSegment::ElemSegment(ElemSegment *this,Store *store,ElemDesc *desc,Ptr *inst)

{
  bool bVar1;
  size_type __n;
  reference pFVar2;
  Instance *this_00;
  value_type local_128;
  size_t local_120;
  Enum local_114;
  FuncDesc local_110;
  Ref local_98;
  Ptr local_90;
  Ref local_78;
  Ref func_ref;
  Value value;
  FuncDesc *elem_expr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *__range2;
  Ptr out_trap;
  Ptr *inst_local;
  ElemDesc *desc_local;
  Store *store_local;
  ElemSegment *this_local;
  
  this->desc_ = desc;
  out_trap.root_index_ = (Index)inst;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->elements_);
  RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)&__range2);
  __n = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::size
                  (&desc->elements);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::reserve(&this->elements_,__n);
  __end2 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::begin
                     (&desc->elements);
  elem_expr = (FuncDesc *)
              std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::end
                        (&desc->elements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                                *)&elem_expr);
    if (!bVar1) {
      RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)&__range2);
      return;
    }
    pFVar2 = __gnu_cxx::
             __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
             ::operator*(&__end2);
    Value::Value((Value *)&func_ref);
    local_98 = RefPtr<wabt::interp::Instance>::ref
                         ((RefPtr<wabt::interp::Instance> *)out_trap.root_index_);
    FuncDesc::FuncDesc(&local_110,pFVar2);
    DefinedFunc::New(&local_90,store,local_98,&local_110);
    local_78 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_90);
    RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_90);
    FuncDesc::~FuncDesc(&local_110);
    this_00 = RefPtr<wabt::interp::Instance>::operator->
                        ((RefPtr<wabt::interp::Instance> *)out_trap.root_index_);
    local_120 = local_78.index;
    local_114 = (Enum)Instance::CallInitFunc
                                (this_00,store,local_78,(Value *)&func_ref,(Ptr *)&__range2);
    bVar1 = Failed((Result)local_114);
    if (bVar1) break;
    local_128.index = (size_t)Value::Get<wabt::interp::Ref>((Value *)&func_ref);
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
              (&this->elements_,&local_128);
    __gnu_cxx::
    __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
    ::operator++(&__end2);
  }
  abort();
}

Assistant:

ElemSegment::ElemSegment(Store& store,
                         const ElemDesc* desc,
                         Instance::Ptr& inst)
    : desc_(desc) {
  Trap::Ptr out_trap;
  elements_.reserve(desc->elements.size());
  for (auto&& elem_expr : desc->elements) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), elem_expr).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, &out_trap))) {
      WABT_UNREACHABLE;  // valid const expression cannot trap
    }
    elements_.push_back(value.Get<Ref>());
  }
}